

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

CavsByColor *
Omega_h::separate_by_color
          (CavsByColor *__return_storage_ptr__,Cavs *cavs,LOs *old_elem_colors,LOs *new_elem_colors)

{
  LO LVar1;
  bool bVar2;
  Read<int> local_120;
  Read<int> local_110;
  Cavs local_100;
  undefined1 local_c0 [8];
  SeparationResult res;
  LOs *new_elem_colors_local;
  LOs *old_elem_colors_local;
  Cavs *cavs_local;
  CavsByColor *cavs_by_color;
  
  std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::vector(__return_storage_ptr__);
  while( true ) {
    LVar1 = Graph::nedges(&cavs->keys2old_elems);
    bVar2 = true;
    if (LVar1 == 0) {
      LVar1 = Graph::nedges(&cavs->keys2new_elems);
      bVar2 = LVar1 != 0;
    }
    if (!bVar2) break;
    Cavs::Cavs(&local_100,cavs);
    Read<int>::Read(&local_110,old_elem_colors);
    Read<int>::Read(&local_120,new_elem_colors);
    separate_by_color_once((SeparationResult *)local_c0,&local_100,&local_110,&local_120);
    Read<int>::~Read(&local_120);
    Read<int>::~Read(&local_110);
    Cavs::~Cavs(&local_100);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
              (__return_storage_ptr__,(value_type *)local_c0);
    Cavs::operator=(cavs,(Cavs *)&res.separated.keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr)
    ;
    SeparationResult::~SeparationResult((SeparationResult *)local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

static CavsByColor separate_by_color(
    Cavs cavs, LOs old_elem_colors, LOs new_elem_colors) {
  CavsByColor cavs_by_color;
  while (cavs.keys2old_elems.nedges() || cavs.keys2new_elems.nedges()) {
    auto res = separate_by_color_once(cavs, old_elem_colors, new_elem_colors);
    cavs_by_color.push_back(res.separated);
    cavs = res.remainder;
  }
  return cavs_by_color;
}